

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

io_context * gmlc::networking::AsioContextManager::getExistingContext(string *contextName)

{
  io_context *piVar1;
  invalid_argument *this;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  
  getExistingContextPointer((AsioContextManager *)&ptr,contextName);
  if (ptr.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    piVar1 = ((ptr.
               super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ictx)._M_t.
             super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &ptr.
                super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return piVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"the context name specified was not available");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

asio::io_context&
    AsioContextManager::getExistingContext(const std::string& contextName)
{
    auto ptr = getExistingContextPointer(contextName);
    if (ptr) {
        return ptr->getBaseContext();
    }
    throw(
        std::invalid_argument("the context name specified was not available"));
}